

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomPointF::write(DomPointF *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffeb8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffec0;
  QString *in_stack_fffffffffffffec8;
  QString *str_00;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1c0f89);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"pointf",6);
    QString::QString((QString *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffeb8);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1c103c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffec0);
  }
  if ((this->m_children & 1) != 0) {
    in_stack_fffffffffffffec8 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QString::number(this->m_x,(char)local_98,0x66);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffec8,local_58);
    QString::~QString((QString *)0x1c110a);
    QString::~QString((QString *)0x1c1117);
  }
  if ((this->m_children & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QString::number(this->m_y,(char)local_e8,0x66);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)pQVar2,local_a8);
    QString::~QString((QString *)0x1c11c0);
    QString::~QString((QString *)0x1c11cd);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomPointF::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("pointf") : tagName.toLower());

    if (m_children & X)
        writer.writeTextElement(u"x"_s, QString::number(m_x, 'f', 15));

    if (m_children & Y)
        writer.writeTextElement(u"y"_s, QString::number(m_y, 'f', 15));

    writer.writeEndElement();
}